

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::IsConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  uint local_2c;
  uint32_t i;
  Instruction *type_inst;
  uint32_t type_id_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  this_01 = analysis::DefUseManager::GetDef(this_00,type_id);
  OVar2 = opt::Instruction::opcode(this_01);
  if ((OVar2 == OpTypeInt) || (OVar2 = opt::Instruction::opcode(this_01), OVar2 == OpTypeFloat)) {
    return true;
  }
  OVar2 = opt::Instruction::opcode(this_01);
  if ((OVar2 != OpTypeVector) &&
     ((OVar2 = opt::Instruction::opcode(this_01), OVar2 != OpTypeMatrix &&
      (OVar2 = opt::Instruction::opcode(this_01), OVar2 != OpTypeArray)))) {
    OVar2 = opt::Instruction::opcode(this_01);
    if (OVar2 != OpTypeStruct) {
      return false;
    }
    local_2c = 0;
    while( true ) {
      uVar3 = opt::Instruction::NumInOperands(this_01);
      if (uVar3 <= local_2c) {
        return true;
      }
      uVar3 = opt::Instruction::GetSingleWordInOperand(this_01,local_2c);
      bVar1 = IsConcreteType(this,uVar3);
      if (!bVar1) break;
      local_2c = local_2c + 1;
    }
    return false;
  }
  uVar3 = opt::Instruction::GetSingleWordInOperand(this_01,0);
  bVar1 = IsConcreteType(this,uVar3);
  return bVar1;
}

Assistant:

bool ReplaceDescArrayAccessUsingVarIndex::IsConcreteType(
    uint32_t type_id) const {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
  if (type_inst->opcode() == spv::Op::OpTypeInt ||
      type_inst->opcode() == spv::Op::OpTypeFloat) {
    return true;
  }
  if (type_inst->opcode() == spv::Op::OpTypeVector ||
      type_inst->opcode() == spv::Op::OpTypeMatrix ||
      type_inst->opcode() == spv::Op::OpTypeArray) {
    return IsConcreteType(type_inst->GetSingleWordInOperand(0));
  }
  if (type_inst->opcode() == spv::Op::OpTypeStruct) {
    for (uint32_t i = 0; i < type_inst->NumInOperands(); ++i) {
      if (!IsConcreteType(type_inst->GetSingleWordInOperand(i))) return false;
    }
    return true;
  }
  return false;
}